

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vlr(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int iVar1;
  uint32_t dofs;
  uint32_t aofs;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_v1,FLD_C_b1);
  dofs = vec_full_reg_offset((uint8_t)iVar1);
  iVar1 = get_field1(s,FLD_O_v2,FLD_C_d4);
  aofs = vec_full_reg_offset((uint8_t)iVar1);
  tcg_gen_gvec_mov_s390x(tcg_ctx_00,0,dofs,aofs,0x10,0x10);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_vlr(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_gvec_mov(tcg_ctx, get_field(s, v1), get_field(s, v2));
    return DISAS_NEXT;
}